

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmResourceInfoCommon::GetUnifiedAuxSurfaceOffset
          (GmmResourceInfoCommon *this,GMM_UNIFIED_AUX_TYPE GmmAuxType)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong *puVar2;
  undefined4 extraout_var_01;
  SKU_FEATURE_TABLE *pSVar3;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_GFX_SIZE_T Offset;
  GMM_UNIFIED_AUX_TYPE GmmAuxType_local;
  GmmResourceInfoCommon *this_local;
  
  pPlatform = (GMM_PLATFORM_INFO *)0x0;
  (*this->pClientContext->_vptr_GmmClientContext[0x10])();
  if (((ulong)(this->Surf).Flags.Gpu >> 0x25 & 1) == 0) {
    if (((GmmAuxType == GMM_AUX_CC) && (((ulong)(this->Surf).Flags.Gpu >> 0xc & 1) != 0)) &&
       (((ulong)(this->Surf).Flags.Gpu >> 10 & 1) != 0)) {
      pPlatform = (GMM_PLATFORM_INFO *)((this->Surf).Size - 8);
    }
    else if (((GmmAuxType == GMM_AUX_CC) && (((ulong)(this->Surf).Flags.Gpu >> 2 & 1) != 0)) &&
            (((ulong)(this->Surf).Flags.Gpu >> 1 & 1) == 0)) {
      pPlatform = (GMM_PLATFORM_INFO *)(this->Surf).Size;
    }
    else {
      pPlatform = (GMM_PLATFORM_INFO *)0x0;
    }
  }
  else if (((GmmAuxType == GMM_AUX_CCS) || (GmmAuxType == GMM_AUX_SURF)) ||
          ((GmmAuxType == GMM_AUX_Y_CCS ||
           ((GmmAuxType == GMM_AUX_HIZ || (GmmAuxType == GMM_AUX_MCS)))))) {
    pPlatform = (GMM_PLATFORM_INFO *)(this->Surf).Size;
    if (((GmmAuxType == GMM_AUX_CCS) &&
        (((this->AuxSecSurf).Type != RESOURCE_INVALID &&
         (((ulong)(this->Surf).Flags.Gpu >> 1 & 1) != 0)))) &&
       ((1 < (this->Surf).MSAA.NumSamples || (((ulong)(this->Surf).Flags.Gpu >> 6 & 1) != 0)))) {
      pPlatform = (GMM_PLATFORM_INFO *)
                  ((long)&(pPlatform->Platform).eProductFamily + (this->AuxSurf).Size);
    }
  }
  else if (GmmAuxType == GMM_AUX_UV_CCS) {
    pPlatform = (GMM_PLATFORM_INFO *)
                ((this->Surf).Size +
                (this->AuxSurf).Pitch *
                (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[6]);
    if ((((ulong)(this->Surf).Flags.Gpu >> 1 & 1) == 0) ||
       (((ulong)(this->AuxSurf).Flags.Gpu >> 0x2b & 1) == 0)) {
      if ((((ulong)(this->Surf).Flags.Gpu >> 0x10 & 1) != 0) &&
         (((ulong)(this->AuxSurf).Flags.Gpu >> 0x2b & 1) != 0)) {
        pPlatform = (GMM_PLATFORM_INFO *)
                    ((this->Surf).Size +
                    (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1]);
      }
    }
    else {
      pPlatform = (GMM_PLATFORM_INFO *)
                  ((this->Surf).Size +
                  (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2]);
    }
  }
  else if ((GmmAuxType == GMM_AUX_CC) &&
          ((((ulong)(this->Surf).Flags.Gpu >> 0xc & 1) != 0 ||
           (((ulong)(this->Surf).Flags.Gpu >> 2 & 1) != 0)))) {
    pPlatform = (GMM_PLATFORM_INFO *)((this->Surf).Size + (this->AuxSurf).UnpaddedSize);
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var,iVar1));
    if (((ulong)pSVar3->field_1 >> 0x22 & 1) != 0) {
      iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1b])();
      puVar2 = (ulong *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x178))();
      if (((*puVar2 & 1) == 0) && (1 < (this->Surf).MSAA.NumSamples)) {
        pPlatform = (GMM_PLATFORM_INFO *)(this->Surf).Size;
      }
    }
  }
  else if (GmmAuxType == GMM_AUX_COMP_STATE) {
    pPlatform = (GMM_PLATFORM_INFO *)
                ((this->Surf).Size +
                 (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1] +
                (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2]);
  }
  else if ((((GmmAuxType == GMM_AUX_ZCS) && (((ulong)(this->Surf).Flags.Gpu >> 6 & 1) != 0)) &&
           (((ulong)(this->Surf).Flags.Gpu >> 1 & 1) != 0)) &&
          ((this->AuxSecSurf).Type != RESOURCE_INVALID)) {
    pPlatform = (GMM_PLATFORM_INFO *)((this->Surf).Size + (this->AuxSurf).Size);
  }
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_01,iVar1));
  if (((((ulong)pSVar3->field_1 >> 0x19 & 1) != 0) &&
      (((ulong)(this->Surf).Flags.Gpu >> 0x15 & 1) == 0)) &&
     ((GmmAuxType == GMM_AUX_CCS ||
      (((GmmAuxType == GMM_AUX_ZCS || (GmmAuxType == GMM_AUX_Y_CCS)) ||
       (GmmAuxType == GMM_AUX_UV_CCS)))))) {
    pPlatform = (GMM_PLATFORM_INFO *)0x0;
  }
  return (GMM_GFX_SIZE_T)pPlatform;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_GFX_SIZE_T GMM_STDCALL GetUnifiedAuxSurfaceOffset(GMM_UNIFIED_AUX_TYPE GmmAuxType)
            {
                GMM_GFX_SIZE_T Offset = 0;
		const GMM_PLATFORM_INFO *pPlatform;
		pPlatform = (GMM_PLATFORM_INFO *)GMM_OVERRIDE_EXPORTED_PLATFORM_INFO(&Surf, GetGmmLibContext());
		GMM_UNREFERENCED_PARAMETER(pPlatform);

                if (Surf.Flags.Gpu.UnifiedAuxSurface)
                {
                    if ((GmmAuxType == GMM_AUX_CCS) || (GmmAuxType == GMM_AUX_SURF) || (GmmAuxType == GMM_AUX_Y_CCS)
                        || (GmmAuxType == GMM_AUX_HIZ) || (GmmAuxType == GMM_AUX_MCS))
                    {
                        Offset = Surf.Size;
                        if (GmmAuxType == GMM_AUX_CCS && AuxSecSurf.Type != RESOURCE_INVALID
                            && (Surf.Flags.Gpu.CCS && (Surf.MSAA.NumSamples > 1 ||
                                Surf.Flags.Gpu.Depth)))
                        {
                            Offset += AuxSurf.Size;
                        }
                    }
                    else if (GmmAuxType == GMM_AUX_UV_CCS)
                    {
                        Offset = Surf.Size + (AuxSurf.Pitch * AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_U]); //Aux Offset in HwLayout

                        if (Surf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS)
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                        }
                        else if (Surf.Flags.Gpu.MMC && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS )
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y];
                        }
                    }
                    else if ((GmmAuxType == GMM_AUX_CC) && (Surf.Flags.Gpu.IndirectClearColor || Surf.Flags.Gpu.ColorDiscard))
                    {
                        Offset = Surf.Size + AuxSurf.UnpaddedSize;
			
			if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression
#ifndef __GMM_KMD__
                        && !(((GMM_AIL_STRUCT *)(GetGmmClientContext()->GmmGetAIL()))->AilDisableXe2CompressionRequest)
#endif
			)
			{
	                    if (Surf.MSAA.NumSamples > 1)
	                    {
	                        Offset = Surf.Size; // Beginning of MCS which is first 4K of AuxSurf, Clear colour is stored only for MSAA surfaces
	                    }
	                }
                    }
                    else if (GmmAuxType == GMM_AUX_COMP_STATE)
                    {
                        Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y] + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                    }
                    else if ((GmmAuxType == GMM_AUX_ZCS) && Surf.Flags.Gpu.Depth && Surf.Flags.Gpu.CCS)
                    {
                        if (AuxSecSurf.Type != RESOURCE_INVALID)
                        {
                            Offset = Surf.Size + AuxSurf.Size;
                        }
                    }
                }
                else if(GmmAuxType == GMM_AUX_CC &&
                        Surf.Flags.Gpu.IndirectClearColor &&
                        Surf.Flags.Gpu.HiZ)
                {
                    Offset = Surf.Size - GMM_HIZ_CLEAR_COLOR_SIZE;
                }
                else if (GmmAuxType == GMM_AUX_CC &&
                    Surf.Flags.Gpu.ColorDiscard &&
                    !Surf.Flags.Gpu.CCS)
                {
                    Offset = Surf.Size;
                }
                else
                {
                    Offset = 0;
                }

                if((GetGmmLibContext()->GetSkuTable().FtrFlatPhysCCS) && !Surf.Flags.Gpu.ProceduralTexture &&
                    (GmmAuxType == GMM_AUX_CCS || GmmAuxType == GMM_AUX_ZCS ||
                    GmmAuxType == GMM_AUX_Y_CCS || GmmAuxType == GMM_AUX_UV_CCS))
                {
                    Offset = 0;
                }

                return Offset;
            }